

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

zt_mem_heap * zt_mem_heap_init(char *name,size_t size)

{
  char *pcVar1;
  char *in_RSI;
  zt_mem_heap *heap;
  zt_mem_heap *local_8;
  
  local_8 = (zt_mem_heap *)(*GLOBAL_zmt.alloc)((size_t)(in_RSI + 0x10));
  if (local_8 == (zt_mem_heap *)0x0) {
    local_8 = (zt_mem_heap *)0x0;
  }
  else {
    pcVar1 = zt_mem_strdup(in_RSI);
    local_8->name = pcVar1;
    local_8->size = (size_t)in_RSI;
  }
  return local_8;
}

Assistant:

zt_mem_heap*
zt_mem_heap_init(char *name, size_t size)
{
    zt_mem_heap * heap;

    if ((heap = GLOBAL_zmt.alloc(sizeof(zt_mem_heap) + size)) == NULL) {
        return NULL;
    }

    heap->name = zt_mem_strdup(name ? name : "*unknown*");
    heap->size = size;
    return heap;
}